

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O1

void __thiscall antlr::TokenBuffer::fill(TokenBuffer *this,uint amount)

{
  iterator __first;
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  TokenRefCount<antlr::Token> TStack_28;
  
  uVar4 = (ulong)this->numToConsume;
  if (uVar4 != 0) {
    if (this->nMarkers == 0) {
      __first._M_current =
           (this->queue).storage.
           super__Vector_base<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      uVar1 = (this->queue).m_offset;
      uVar2 = ((long)(this->queue).storage.
                     super__Vector_base<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)__first._M_current >> 3) -
              uVar1;
      if (uVar4 <= uVar2) {
        uVar2 = uVar4;
      }
      if (uVar1 < 5000) {
        sVar3 = uVar2 + uVar1;
      }
      else {
        std::
        vector<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
        ::_M_erase(&(this->queue).storage,__first,__first._M_current + uVar1 + uVar2);
        sVar3 = 0;
      }
      (this->queue).m_offset = sVar3;
    }
    else {
      this->markerOffset = this->markerOffset + this->numToConsume;
    }
    this->numToConsume = 0;
  }
  if (((long)(this->queue).storage.
             super__Vector_base<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->queue).storage.
             super__Vector_base<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) - (this->queue).m_offset <
      (ulong)(this->markerOffset + amount)) {
    do {
      (**this->input->_vptr_TokenStream)(&TStack_28);
      std::
      vector<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
      ::push_back(&(this->queue).storage,&TStack_28);
      TokenRefCount<antlr::Token>::~TokenRefCount(&TStack_28);
    } while (((long)(this->queue).storage.
                    super__Vector_base<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->queue).storage.
                    super__Vector_base<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) - (this->queue).m_offset <
             (ulong)(this->markerOffset + amount));
  }
  return;
}

Assistant:

void TokenBuffer::fill(unsigned int amount)
{
	syncConsume();
	// Fill the buffer sufficiently to hold needed tokens
	while (queue.entries() < (amount + markerOffset))
	{
		// Append the next token
		queue.append(input.nextToken());
	}
}